

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

void zmSqrBarr(word *b,word *a,qr_o *r,void *stack)

{
  word *in_RCX;
  long in_RDX;
  void *in_RSI;
  word *in_RDI;
  word *prod;
  
  zzSqr(b,a,(size_t)r,stack);
  zzRedBarr((word *)r,(word *)stack,(size_t)prod,in_RDI,in_RSI);
  wwCopy(in_RDI,in_RCX,*(size_t *)(in_RDX + 0x30));
  return;
}

Assistant:

static void zmSqrBarr(word b[], const word a[], const qr_o* r, void* stack)
{
	word* prod = (word*)stack;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	stack = prod + 2 * r->n;
	zzSqr(prod, a, r->n, stack);
	zzRedBarr(prod, r->mod, r->n, r->params, stack);
	wwCopy(b, prod, r->n);
}